

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>,_vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>::Args,_vkt::FunctionPrograms1<vkt::pipeline::(anonymous_namespace)::CaseDef>_>
::createInstance(InstanceFactory1<vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>,_vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>::Args,_vkt::FunctionPrograms1<vkt::pipeline::(anonymous_namespace)::CaseDef>_>
                 *this,Context *context)

{
  TestInstance *pTVar1;
  
  pTVar1 = (TestInstance *)operator_new(0x40);
  pTVar1->m_context = context;
  pTVar1->_vptr_TestInstance = (_func_int **)&PTR__TestInstance_00bfcca0;
  FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>::Args::Args
            ((Args *)(pTVar1 + 1),(Args_conflict1 *)&this->m_arg0);
  return pTVar1;
}

Assistant:

TestInstance*	createInstance		(Context& context) const { return new Instance(context, m_arg0); }